

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_object_tuple_t *
sysbvm_context_allocateByteTuple(sysbvm_context_t *context,sysbvm_tuple_t type,size_t byteSize)

{
  size_t newIdentityHash;
  sysbvm_object_tuple_t *result;
  size_t byteSize_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  if (context == (sysbvm_context_t *)0x0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_heap_allocateByteTuple(&context->heap,byteSize);
    newIdentityHash = sysbvm_context_generateIdentityHash(context);
    sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t *)context_local,newIdentityHash);
    if (context_local != (sysbvm_context_t *)0x0) {
      sysbvm_tuple_setType((sysbvm_object_tuple_t *)context_local,type);
    }
  }
  return (sysbvm_object_tuple_t *)context_local;
}

Assistant:

sysbvm_object_tuple_t *sysbvm_context_allocateByteTuple(sysbvm_context_t *context, sysbvm_tuple_t type, size_t byteSize)
{
    if(!context) return 0;

    sysbvm_object_tuple_t *result = sysbvm_heap_allocateByteTuple(&context->heap, byteSize);
    sysbvm_tuple_setIdentityHash(result, sysbvm_context_generateIdentityHash(context));
    if(result)
        sysbvm_tuple_setType(result, type);
    return result;
}